

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_vtlb.c
# Opt level: O1

_Bool unicorn_fill_tlb_arm
                (CPUState *cs,vaddr address,int size,MMUAccessType rw,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  uint uVar1;
  uc_struct_conflict7 *puVar2;
  void *pvVar3;
  byte bVar4;
  bool bVar5;
  list_item *plVar6;
  byte bVar7;
  undefined7 in_register_00000089;
  ulong uVar8;
  ulong local_50;
  uint local_48;
  uint local_40;
  int local_3c;
  CPUState *local_38;
  
  uVar8 = CONCAT71(in_register_00000089,probe);
  puVar2 = cs->uc;
  plVar6 = puVar2->hook[0x11].head;
  if (plVar6 == (list_item *)0x0) {
    bVar4 = 0;
    bVar5 = false;
  }
  else {
    local_40 = (uint)uVar8;
    bVar7 = 0x12;
    if (rw != MMU_INST_FETCH) {
      bVar7 = rw == MMU_DATA_STORE | 0x10;
    }
    bVar5 = false;
    bVar4 = 0;
    local_3c = mmu_idx;
    local_38 = cs;
    do {
      pvVar3 = plVar6->data;
      if (pvVar3 == (void *)0x0) break;
      if ((*(char *)((long)pvVar3 + 0x14) == '\0') &&
         (((*(ulong *)((long)pvVar3 + 0x18) <= address &&
           (address <= *(ulong *)((long)pvVar3 + 0x20))) ||
          (*(ulong *)((long)pvVar3 + 0x20) < *(ulong *)((long)pvVar3 + 0x18))))) {
        bVar4 = (**(code **)((long)pvVar3 + 0x28))
                          (puVar2,(long)puVar2->init_target_page->mask & address,bVar7,&local_50,
                           *(undefined8 *)((long)pvVar3 + 0x30));
        bVar5 = true;
        if (bVar4 != 0) break;
      }
      plVar6 = plVar6->next;
    } while (plVar6 != (list_item *)0x0);
    uVar8 = (ulong)local_40;
    cs = local_38;
    mmu_idx = local_3c;
  }
  if (bVar5) {
    if ((bVar4 & 1) == 0) goto LAB_0057f133;
  }
  else {
    local_50 = (long)puVar2->init_target_page->mask & address;
    local_48 = 0;
    if (rw < (MMU_INST_FETCH|MMU_DATA_STORE)) {
      local_48 = *(uint *)(&DAT_00d70c48 + (ulong)rw * 4);
    }
  }
  if (rw == MMU_INST_FETCH) {
    bVar4 = (byte)local_48 >> 2;
  }
  else if (rw == MMU_DATA_STORE) {
    bVar4 = (byte)local_48 >> 1;
  }
  else {
    bVar4 = (byte)local_48;
    if (rw != MMU_DATA_LOAD) {
      bVar4 = 0;
    }
  }
  if ((bVar4 & 1) != 0) {
    uVar1 = puVar2->init_target_page->mask;
    tlb_set_page_arm(cs,(uint)address & uVar1,(long)(int)uVar1 & local_50,local_48 & 7,mmu_idx,
                     -uVar1);
    return true;
  }
LAB_0057f133:
  if ((char)uVar8 != '\0') {
    return false;
  }
  puVar2 = cs->uc;
  puVar2->invalid_error = 0x15;
  puVar2->invalid_addr = address & 0xffffffff;
  cpu_exit(puVar2->cpu);
  cpu_loop_exit_restore_arm(cs,retaddr);
}

Assistant:

bool unicorn_fill_tlb(CPUState *cs, vaddr address, int size,
                      MMUAccessType rw, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    bool handled = false;
    bool ret = false;
    struct uc_struct *uc = cs->uc;
    uc_tlb_entry e;
    struct hook *hook;
    HOOK_FOREACH_VAR_DECLARE;

    HOOK_FOREACH(uc, hook, UC_HOOK_TLB_FILL) {
        if (hook->to_delete) {
            continue;
        }
        if (!HOOK_BOUND_CHECK(hook, address)) {
            continue;
        }
        handled = true;
        if ((ret = ((uc_cb_tlbevent_t)hook->callback)(uc, address & TARGET_PAGE_MASK, rw_to_mem_type(rw), &e, hook->user_data))) {
            break;
        }
    }

    if (handled && !ret) {
        goto tlb_miss;
    }

    if (!handled) {
        e.paddr = address & TARGET_PAGE_MASK;
        switch (rw) {
        case MMU_DATA_LOAD:
            e.perms = UC_PROT_READ;
            break;
        case MMU_DATA_STORE:
            e.perms = UC_PROT_WRITE;
            break;
        case MMU_INST_FETCH:
            e.perms = UC_PROT_EXEC;
            break;
        default:
            e.perms = 0;
            break;
        }
    }

    switch (rw) {
    case MMU_DATA_LOAD:
        ret = e.perms & UC_PROT_READ;
        break;
    case MMU_DATA_STORE:
        ret = e.perms & UC_PROT_WRITE;
        break;
    case MMU_INST_FETCH:
        ret = e.perms & UC_PROT_EXEC;
        break;
    default:
        ret = false;
        break;
    }

    if (ret) {
        tlb_set_page(cs, address & TARGET_PAGE_MASK, e.paddr & TARGET_PAGE_MASK, perms_to_prot(e.perms), mmu_idx, TARGET_PAGE_SIZE);
        return true;
    }

tlb_miss:
    if (probe) {
        return false;
    }
    raise_mmu_exception(cs, address, rw, retaddr);
    return false;
}